

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

endpoint_type * __thiscall
asio::basic_socket<asio::ip::tcp,_asio::any_io_executor>::remote_endpoint
          (endpoint_type *__return_storage_ptr__,
          basic_socket<asio::ip::tcp,_asio::any_io_executor> *this)

{
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service<asio::ip::tcp>::remote_endpoint
            (__return_storage_ptr__,(this->impl_).service_,&(this->impl_).implementation_,&local_28)
  ;
  detail::throw_error(&local_28,"remote_endpoint");
  return __return_storage_ptr__;
}

Assistant:

endpoint_type remote_endpoint() const
  {
    asio::error_code ec;
    endpoint_type ep = impl_.get_service().remote_endpoint(
        impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "remote_endpoint");
    return ep;
  }